

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

String __thiscall xmrig::Process::location(Process *this,Location location,char *fileName)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  char *in_RCX;
  int in_EDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t sVar3;
  String *in_RDI;
  String SVar4;
  char *p;
  size_t size;
  char *buf;
  size_t max;
  char *in_stack_ffffffffffffff98;
  String *in_stack_ffffffffffffffa0;
  String *this_00;
  size_t local_38;
  
  this_00 = in_RDI;
  __s = (char *)operator_new__(0x208);
  memset(__s,0,0x208);
  local_38 = ::location((Location)((ulong)this_00 >> 0x20),(char *)in_stack_ffffffffffffffa0,
                        (size_t)in_stack_ffffffffffffff98);
  if (local_38 == 0) {
    if (__s != (char *)0x0) {
      operator_delete__(__s);
    }
    memset(this_00,0,0x10);
    String::String(this_00);
    sVar3 = extraout_RDX;
  }
  else if (in_RCX == (char *)0x0) {
    String::String(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    sVar3 = extraout_RDX_00;
  }
  else {
    if (in_EDX == 0) {
      pcVar1 = strrchr(__s,0x2f);
      if (pcVar1 == (char *)0x0) {
        if (__s != (char *)0x0) {
          operator_delete__(__s);
        }
        memset(this_00,0,0x10);
        String::String(this_00);
        sVar3 = extraout_RDX_01;
        goto LAB_001b8f4f;
      }
      local_38 = (long)pcVar1 - (long)__s;
    }
    sVar2 = strlen(in_RCX);
    if (local_38 + sVar2 + 2 < 0x208) {
      __s[local_38] = '/';
      strcpy(__s + local_38 + 1,in_RCX);
      String::String(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      sVar3 = extraout_RDX_03;
    }
    else {
      if (__s != (char *)0x0) {
        operator_delete__(__s);
      }
      memset(this_00,0,0x10);
      String::String(this_00);
      sVar3 = extraout_RDX_02;
    }
  }
LAB_001b8f4f:
  SVar4.m_size = sVar3;
  SVar4.m_data = (char *)in_RDI;
  return SVar4;
}

Assistant:

xmrig::String xmrig::Process::location(Location location, const char *fileName) const
{
    constexpr const size_t max = 520;

    char *buf   = new char[max]();
    size_t size = ::location(location, buf, max);

    if (size == 0) {
        delete [] buf;

        return String();
    }

    if (fileName == nullptr) {
        return buf;
    }

    if (location == ExeLocation) {
        char *p = strrchr(buf, kDirSeparator);

        if (p == nullptr) {
            delete [] buf;

            return String();
        }

        size = static_cast<size_t>(p - buf);
    }

    if ((size + strlen(fileName) + 2) >= max) {
        delete [] buf;

        return String();
    }

    buf[size] = kDirSeparator;
    strcpy(buf + size + 1, fileName);

    return buf;
}